

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O0

int S2::GetExitAxis(S2PointUVW *n)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  BasicVector<Vector3,_double,_3UL> *local_18;
  S2PointUVW *n_local;
  
  local_18 = (BasicVector<Vector3,_double,_3UL> *)n;
  bVar1 = IntersectsFace(n);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.cc"
               ,0x6f,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar4 = S2LogMessage::stream(&local_30);
    poVar4 = std::operator<<(poVar4,"Check failed: IntersectsFace(n) ");
    S2LogMessageVoidify::operator&(&local_19,poVar4);
  }
  if ((local_31 & 1) == 0) {
    bVar1 = IntersectsOppositeEdges((S2PointUVW *)local_18);
    if (bVar1) {
      dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[](local_18,0)
      ;
      dVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[](local_18,1)
      ;
      bVar1 = ABS(dVar5) <= ABS(dVar6);
    }
    else {
      dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[](local_18,0)
      ;
      bVar1 = false;
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                          (local_18,1);
        bVar1 = false;
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                            (local_18,2);
          bVar1 = dVar6 != 0.0;
        }
      }
      if (!bVar1) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_58,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.cc"
                   ,0x7a,kFatal,(ostream *)&std::cerr);
        poVar4 = S2LogMessage::stream(&local_58);
        poVar4 = std::operator<<(poVar4,"Check failed: n[0] != 0 && n[1] != 0 && n[2] != 0 ");
        S2LogMessageVoidify::operator&(local_45,poVar4);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
      }
      dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[](local_18,0)
      ;
      bVar1 = std::signbit(dVar6);
      dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[](local_18,1)
      ;
      bVar2 = std::signbit(dVar6);
      dVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[](local_18,2)
      ;
      bVar3 = std::signbit(dVar6);
      bVar1 = (bVar1 != bVar2) == bVar3;
    }
    n_local._4_4_ = (uint)bVar1;
    return n_local._4_4_;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

static int GetExitAxis(const S2PointUVW& n) {
  S2_DCHECK(IntersectsFace(n));
  if (IntersectsOppositeEdges(n)) {
    // The line passes through through opposite edges of the face.
    // It exits through the v=+1 or v=-1 edge if the u-component of N has a
    // larger absolute magnitude than the v-component.
    return (fabs(n[0]) >= fabs(n[1])) ? 1 : 0;
  } else {
    // The line passes through through two adjacent edges of the face.
    // It exits the v=+1 or v=-1 edge if an even number of the components of N
    // are negative.  We test this using signbit() rather than multiplication
    // to avoid the possibility of underflow.
    S2_DCHECK(n[0] != 0 && n[1] != 0  && n[2] != 0);
    using std::signbit;
    return ((signbit(n[0]) ^ signbit(n[1]) ^ signbit(n[2])) == 0) ? 1 : 0;
  }
}